

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crypto.cpp
# Opt level: O1

bool __thiscall
KeyStore::load(KeyStore *this,vector<unsigned_char,_std::allocator<unsigned_char>_> *keystore,
              string *pass)

{
  bool bVar1;
  string *extraout_RDX;
  undefined1 local_38 [8];
  MemBuffer buf;
  
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_38,keystore);
  buf.data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if ((ulong)((long)buf.data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_start - (long)local_38) < 0xc) {
    bVar1 = false;
  }
  else {
    bVar1 = load(this,(MemBuffer *)local_38,extraout_RDX);
  }
  if (local_38 != (undefined1  [8])0x0) {
    operator_delete((void *)local_38,
                    (long)buf.data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                          ._M_impl.super__Vector_impl_data._M_finish - (long)local_38);
  }
  return bVar1;
}

Assistant:

bool KeyStore::load(const std::vector<uint8_t>& keystore,
                    const std::string& pass)
{
    MemBuffer buf(keystore);
    if (buf.size() < 12)
        return false;
    return load(buf, pass);
}